

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dry-comparisons.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> * __thiscall
rollbear::internal::logical_tuple<int,int,int>::print<char,std::char_traits<char>>
          (logical_tuple<int,int,int> *this,char *label,
          basic_ostream<char,_std::char_traits<char>_> *os)

{
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *local_18;
  
  poVar1 = std::operator<<(os,label);
  std::operator<<(poVar1,'{');
  local_18 = os;
  std::
  __apply_impl<rollbear::internal::logical_tuple<int,int,int>::print<char,std::char_traits<char>>(char_const*,std::ostream&)const::_lambda((auto:1_const&)___)_1_,std::tuple<int,int,int>const&,0ul,1ul,2ul>
            (&local_18,this);
  poVar1 = std::operator<<(os,'}');
  return poVar1;
}

Assistant:

std::basic_ostream<Char, Traits>& print(const Char* label, std::basic_ostream<Char, Traits>& os) const
    {
        os << label << '{';
        std::apply([&os](const auto& ... v) {
            int first = 1;
            ((os << &","[std::exchange(first, 0)] << v),...);
        }, self());
        return os << '}';
    }